

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

int lj_tab_next(lua_State *L,GCtab *t,TValue *key)

{
  uint uVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Node *pNVar6;
  TValue *pTVar7;
  ulong uVar8;
  
  if ((key->field_2).it < 0xfffeffff) {
    dVar2 = key->n;
    uVar4 = (uint)dVar2;
    if (uVar4 < t->asize) {
      if ((dVar2 == (double)(int)dVar2) && (!NAN(dVar2) && !NAN((double)(int)dVar2)))
      goto LAB_00117b78;
    }
  }
  else if ((key->field_2).it == 0xffffffff) {
    uVar4 = 0xffffffff;
    goto LAB_00117b78;
  }
  pNVar6 = hashkey(t,key);
  do {
    iVar5 = lj_obj_equal(&pNVar6->key,key);
    if (iVar5 != 0) {
      uVar4 = (int)((long)pNVar6 - (ulong)(t->node).ptr32 >> 3) * -0x55555555 + t->asize;
      goto LAB_00117b78;
    }
    pNVar6 = (Node *)(ulong)(pNVar6->next).ptr32;
  } while (pNVar6 != (Node *)0x0);
  if ((key->field_2).it != 0xfffe7fff) {
    lj_err_msg(L,LJ_ERR_NEXTIDX);
  }
  uVar4 = (key->u32).lo - 1;
LAB_00117b78:
  uVar3 = t->asize;
  uVar1 = uVar4 + 1;
  do {
    uVar4 = uVar4 + 1;
    if (uVar3 <= uVar4) {
      uVar4 = uVar1 - uVar3;
      if (uVar1 < uVar3) {
        uVar4 = 0;
      }
      if (t->hmask < uVar4) {
        return 0;
      }
      uVar8 = (ulong)(t->node).ptr32;
      while (*(int *)(uVar8 + 4 + (ulong)uVar4 * 0x18) == -1) {
        uVar4 = uVar4 + 1;
        if (t->hmask < uVar4) {
          return 0;
        }
      }
      pTVar7 = (TValue *)(uVar8 + (ulong)uVar4 * 0x18);
      *key = pTVar7[1];
      goto LAB_00117bda;
    }
  } while (*(int *)((ulong)(t->array).ptr32 + 4 + (ulong)uVar4 * 8) == -1);
  key->n = (double)(int)uVar4;
  pTVar7 = (TValue *)((ulong)(t->array).ptr32 + (ulong)uVar4 * 8);
LAB_00117bda:
  key[1] = *pTVar7;
  return 1;
}

Assistant:

int lj_tab_next(lua_State *L, GCtab *t, TValue *key)
{
  uint32_t i = keyindex(L, t, key);  /* Find predecessor key index. */
  for (i++; i < t->asize; i++)  /* First traverse the array keys. */
    if (!tvisnil(arrayslot(t, i))) {
      setintV(key, i);
      copyTV(L, key+1, arrayslot(t, i));
      return 1;
    }
  for (i -= t->asize; i <= t->hmask; i++) {  /* Then traverse the hash keys. */
    Node *n = &noderef(t->node)[i];
    if (!tvisnil(&n->val)) {
      copyTV(L, key, &n->key);
      copyTV(L, key+1, &n->val);
      return 1;
    }
  }
  return 0;  /* End of traversal. */
}